

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# request.hpp
# Opt level: O0

void __thiscall m2d::savanna::ssl_reuse::request::~request(request *this)

{
  shared_ptr<m2d::savanna::endpoint> local_20;
  request *local_10;
  request *this_local;
  
  this->_vptr_request = (_func_int **)&PTR__request_0039bd30;
  local_10 = this;
  std::shared_ptr<m2d::savanna::endpoint>::shared_ptr(&local_20,(nullptr_t)0x0);
  std::shared_ptr<m2d::savanna::endpoint>::operator=(&this->endpoint,&local_20);
  std::shared_ptr<m2d::savanna::endpoint>::~shared_ptr(&local_20);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map(&this->header_fields);
  std::__cxx11::string::~string((string *)&this->body);
  std::shared_ptr<m2d::savanna::endpoint>::~shared_ptr(&this->endpoint);
  return;
}

Assistant:

virtual ~request()
			{
				endpoint = nullptr;
			}